

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkFraigSweep(Abc_Ntk_t *pNtk,int fUseInv,int fExdc,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pNtk_00;
  void *pvVar4;
  Fraig_Man_t *pMan_00;
  stmm_table *tEquiv_00;
  int local_8c;
  int fUseTrick;
  int i;
  Abc_Obj_t *pObj;
  stmm_table *tEquiv;
  Fraig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Fraig_Params_t Params;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fExdc_local;
  int fUseInv_local;
  Abc_Ntk_t *pNtk_local;
  
  Params.nInspLimit._0_4_ = fVeryVerbose;
  Params.nInspLimit._4_4_ = fVerbose;
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 != 0) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x47,"int Abc_NtkFraigSweep(Abc_Ntk_t *, int, int, int, int)");
  }
  bVar1 = false;
  iVar2 = Abc_NtkIsMappedLogic(pNtk);
  if (iVar2 != 0) {
    bVar1 = true;
    for (local_8c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_8c < iVar2; local_8c = local_8c + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_8c);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) {
        pAVar3->pNext = (Abc_Obj_t *)pAVar3->field_5;
      }
    }
  }
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  if (bVar1) {
    Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
    pvVar4 = Abc_FrameReadLibGen();
    pNtk->pManFunc = pvVar4;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    for (local_8c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_8c < iVar2; local_8c = local_8c + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_8c);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) {
        pAVar3->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar3->pNext;
        pAVar3->pNext = (Abc_Obj_t *)0x0;
      }
    }
  }
  Fraig_ParamsSetDefault((Fraig_Params_t *)&pNtkAig);
  Params.fVerbose = 1;
  pMan_00 = (Fraig_Man_t *)Abc_NtkToFraig(pNtk_00,&pNtkAig,0,0);
  if (fExdc != 0) {
    if (pNtk->pExdc == (Abc_Ntk_t *)0x0) {
      printf("Warning: Networks has no EXDC.\n");
    }
    else {
      Abc_NtkFraigSweepUsingExdc(pMan_00,pNtk);
    }
  }
  Abc_NtkLevel(pNtk);
  tEquiv_00 = Abc_NtkFraigEquiv(pNtk,fUseInv,Params.nInspLimit._4_4_,(int)Params.nInspLimit);
  Abc_NtkFraigTransform(pNtk,tEquiv_00,fUseInv,Params.nInspLimit._4_4_);
  stmm_free_table(tEquiv_00);
  Fraig_ManFree(pMan_00);
  Abc_NtkDelete(pNtk_00);
  iVar2 = Abc_NtkHasMapping(pNtk);
  if (iVar2 == 0) {
    Abc_NtkSweep(pNtk,Params.nInspLimit._4_4_);
  }
  else {
    Abc_NtkCleanup(pNtk,Params.nInspLimit._4_4_);
  }
  iVar2 = Abc_NtkCheck(pNtk);
  if (iVar2 == 0) {
    printf("Abc_NtkFraigSweep: The network check has failed.\n");
  }
  pNtk_local._4_4_ = (uint)(iVar2 != 0);
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig;
    Fraig_Man_t * pMan;
    stmm_table * tEquiv;
    Abc_Obj_t * pObj;
    int i, fUseTrick;

    assert( !Abc_NtkIsStrash(pNtk) );

    // save gate assignments
    fUseTrick = 0;
    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        fUseTrick = 1;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pNext = (Abc_Obj_t *)pObj->pData;
    }
    // derive the AIG
    pNtkAig = Abc_NtkStrash( pNtk, 0, 1, 0 );
    // reconstruct gate assignments
    if ( fUseTrick )
    {
//        extern void * Abc_FrameReadLibGen(); 
        Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
        pNtk->pManFunc = Abc_FrameReadLibGen();
        pNtk->ntkFunc = ABC_FUNC_MAP;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pData = pObj->pNext, pObj->pNext = NULL;
    }

    // perform fraiging of the AIG
    Fraig_ParamsSetDefault( &Params );
    Params.fInternal = 1;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtkAig, &Params, 0, 0 );   
    // cannot use EXDC with FRAIG because it can create classes of equivalent FRAIG nodes
    // with representative nodes that do not correspond to the nodes with the current network

    // update FRAIG using EXDC
    if ( fExdc )
    {
        if ( pNtk->pExdc == NULL )
            printf( "Warning: Networks has no EXDC.\n" );
        else
            Abc_NtkFraigSweepUsingExdc( pMan, pNtk );
    }
    // assign levels to the nodes of the network
    Abc_NtkLevel( pNtk );

    // collect the classes of equivalent nets
    tEquiv = Abc_NtkFraigEquiv( pNtk, fUseInv, fVerbose, fVeryVerbose );

    // transform the network into the equivalent one
    Abc_NtkFraigTransform( pNtk, tEquiv, fUseInv, fVerbose );
    stmm_free_table( tEquiv );

    // free the manager
    Fraig_ManFree( pMan );
    Abc_NtkDelete( pNtkAig );

    // cleanup the dangling nodes
    if ( Abc_NtkHasMapping(pNtk) )
        Abc_NtkCleanup( pNtk, fVerbose );
    else
        Abc_NtkSweep( pNtk, fVerbose );

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkFraigSweep: The network check has failed.\n" );
        return 0;
    }
    return 1;
}